

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O0

void __thiscall UnitTest_lex6::UnitTest_lex6(UnitTest_lex6 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_00268720;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"lex6");
  return;
}

Assistant:

TEST_CASE(lex6)
{
    LexerWrapper lexer("and do else elseif end false for function if in local "
                       "nil not or repeat return then true until while");
    EXPECT_TRUE(lexer.GetToken() == luna::Token_And);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Do);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Else);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Elseif);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_End);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_False);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_For);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Function);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_If);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_In);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Local);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Nil);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Not);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Or);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Repeat);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Return);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Then);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_True);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Until);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_While);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}